

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver::
receive(entityx::EntityDestroyedEvent_const__(void *this,EntityDestroyedEvent *event)

{
  Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::push_back
            ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)((long)this + 0x40),
             (value_type *)(event + 8));
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }